

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.h
# Opt level: O1

bool ViconCGStreamIO::VBufferDetail<0>::Read(VBufferImpl *i_rBufferImpl,string *o_rValue)

{
  int iVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  pointer puVar6;
  uint uVar7;
  
  uVar4 = i_rBufferImpl->m_Offset;
  puVar2 = (i_rBufferImpl->m_Buffer).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = (i_rBufferImpl->m_Buffer).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)puVar2 - (long)puVar6;
  if (uVar5 < (ulong)uVar4 + 4) {
    bVar3 = false;
  }
  else {
    iVar1 = *(int *)(puVar6 + uVar4);
    i_rBufferImpl->m_Offset = uVar4 + 4;
    uVar7 = i_rBufferImpl->m_Offset + iVar1;
    uVar4 = (uint)uVar5;
    bVar3 = uVar7 <= uVar4;
    if (uVar7 <= uVar4) {
      if (puVar6 == puVar2) {
        puVar6 = (pointer)0x0;
      }
      std::__cxx11::string::_M_replace
                ((ulong)o_rValue,0,(char *)o_rValue->_M_string_length,
                 (ulong)(puVar6 + i_rBufferImpl->m_Offset));
      i_rBufferImpl->m_Offset = uVar7;
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

static bool Read( const VBufferImpl & i_rBufferImpl, std::string & o_rValue )
  {
    ViconCGStreamType::UInt32 Size = 0;
    if( !i_rBufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    const unsigned int Offset = i_rBufferImpl.Offset();
    if( Offset + Size > i_rBufferImpl.Length() )
    {
      return false;
    }
    o_rValue.assign( reinterpret_cast< const char * >( i_rBufferImpl.Raw() + Offset ), Size );
    i_rBufferImpl.SetOffset( Offset + Size );
    return true;
  }